

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O2

ompt_interface_fn_t libomp_target_fn_lookup(char *s)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = strcmp(s,"ompt_set_frame_enter");
  if (iVar1 == 0) {
    pcVar2 = ompt_set_frame_enter;
  }
  else {
    iVar1 = strcmp(s,"ompt_get_task_data");
    if (iVar1 == 0) {
      pcVar2 = ompt_get_task_data;
    }
    else {
      iVar1 = strcmp(s,"ompt_callback_device_initialize");
      pcVar2 = ompt_callbacks.ompt_callback_device_initialize_callback;
      if (((((iVar1 != 0) &&
            (iVar1 = strcmp(s,"ompt_callback_device_finalize"),
            pcVar2 = ompt_callbacks.ompt_callback_device_finalize_callback, iVar1 != 0)) &&
           (iVar1 = strcmp(s,"ompt_callback_device_load"),
           pcVar2 = ompt_callbacks.ompt_callback_device_load_callback, iVar1 != 0)) &&
          ((iVar1 = strcmp(s,"ompt_callback_device_unload"),
           pcVar2 = ompt_callbacks.ompt_callback_device_unload_callback, iVar1 != 0 &&
           (iVar1 = strcmp(s,"ompt_callback_target"),
           pcVar2 = ompt_callbacks.ompt_callback_target_callback, iVar1 != 0)))) &&
         ((iVar1 = strcmp(s,"ompt_callback_target_map"),
          pcVar2 = ompt_callbacks.ompt_callback_target_map_callback, iVar1 != 0 &&
          ((iVar1 = strcmp(s,"ompt_callback_target_data_op"),
           pcVar2 = ompt_callbacks.ompt_callback_target_data_op_callback, iVar1 != 0 &&
           (iVar1 = strcmp(s,"ompt_callback_target_submit"),
           pcVar2 = ompt_callbacks.ompt_callback_target_submit_callback, iVar1 != 0)))))) {
        pcVar2 = (ompt_callback_target_data_op_t)0x0;
      }
    }
  }
  return pcVar2;
}

Assistant:

static ompt_interface_fn_t libomp_target_fn_lookup(const char *s) {
  if (strcmp(s, "ompt_set_frame_enter") == 0) 
    return (ompt_interface_fn_t) ompt_set_frame_enter;

  if (strcmp(s, "ompt_get_task_data") == 0) 
    return (ompt_interface_fn_t) ompt_get_task_data;

#define ompt_interface_fn(fn) \
  if (strcmp(s, #fn) == 0) \
  return (ompt_interface_fn_t) ompt_callbacks.ompt_callback(fn);

  FOREACH_OMPT_TARGET_CALLBACK(ompt_interface_fn)

#undef ompt_interface_fn

  return (ompt_interface_fn_t) 0;
}